

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaParser.cpp
# Opt level: O3

void __thiscall Assimp::ColladaParser::ReadImage(ColladaParser *this,Image *pImage)

{
  byte bVar1;
  FormatVersion FVar2;
  char *pcVar3;
  int iVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  Logger *pLVar6;
  byte *pbVar7;
  byte *pbVar8;
  ulong uVar9;
  byte bVar10;
  ulong uVar11;
  uint uVar12;
  byte bVar13;
  char *pcVar14;
  
  iVar4 = (*this->mReader->_vptr_IIrrXMLReader[2])();
  if ((char)iVar4 != '\0') {
    do {
      iVar4 = (*this->mReader->_vptr_IIrrXMLReader[3])();
      iVar5 = (*this->mReader->_vptr_IIrrXMLReader[3])();
      if (iVar4 != 1) {
        if (iVar5 == 2) {
          iVar4 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
          iVar4 = strcmp((char *)CONCAT44(extraout_var_01,iVar4),"image");
          if (iVar4 == 0) {
            return;
          }
        }
        goto LAB_004171c1;
      }
      if (iVar5 != 1) {
LAB_004174d2:
        __assert_fail("mReader->getNodeType() == irr::io::EXN_ELEMENT",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/Collada/ColladaParser.h"
                      ,0x178,"bool Assimp::ColladaParser::IsElement(const char *) const");
      }
      iVar4 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
      iVar4 = strcmp((char *)CONCAT44(extraout_var,iVar4),"image");
      if (iVar4 == 0) {
LAB_00417195:
        SkipElement(this);
      }
      else {
        iVar4 = (*this->mReader->_vptr_IIrrXMLReader[3])();
        if (iVar4 != 1) goto LAB_004174d2;
        iVar4 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
        iVar4 = strcmp((char *)CONCAT44(extraout_var_00,iVar4),"init_from");
        FVar2 = this->mFormat;
        if (iVar4 == 0) {
          if (FVar2 == FV_1_5_n) {
            uVar12 = TestAttribute(this,"array_index");
            if ((uVar12 == 0xffffffff) ||
               (iVar4 = (*this->mReader->_vptr_IIrrXMLReader[10])(this->mReader,(ulong)uVar12),
               iVar4 < 1)) {
              uVar12 = TestAttribute(this,"mip_index");
              if ((uVar12 == 0xffffffff) ||
                 (iVar4 = (*this->mReader->_vptr_IIrrXMLReader[10])(this->mReader,(ulong)uVar12),
                 iVar4 < 1)) goto LAB_004171c1;
              pLVar6 = DefaultLogger::get();
              pcVar14 = "Collada: Ignoring MIP map layer";
            }
            else {
              pLVar6 = DefaultLogger::get();
              pcVar14 = "Collada: Ignoring texture array index";
            }
            Logger::warn(pLVar6,pcVar14);
          }
          else if (FVar2 == FV_1_4_n) {
            iVar4 = (*this->mReader->_vptr_IIrrXMLReader[0xf])();
            if ((char)iVar4 == '\0') {
              pcVar14 = TestTextContent(this);
              if (pcVar14 != (char *)0x0) {
                pcVar3 = (char *)(pImage->mFileName)._M_string_length;
                strlen(pcVar14);
                std::__cxx11::string::_M_replace((ulong)pImage,0,pcVar3,(ulong)pcVar14);
              }
              TestClosing(this,"init_from");
            }
            if ((pImage->mFileName)._M_string_length == 0) {
              std::__cxx11::string::_M_replace((ulong)pImage,0,(char *)0x0,0x696b6d);
            }
          }
        }
        else {
          if (FVar2 != FV_1_5_n) goto LAB_00417195;
          iVar4 = (*this->mReader->_vptr_IIrrXMLReader[3])();
          if (iVar4 != 1) goto LAB_004174d2;
          iVar4 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
          iVar4 = strcmp((char *)CONCAT44(extraout_var_02,iVar4),"ref");
          if (iVar4 == 0) {
            pcVar14 = TestTextContent(this);
            if (pcVar14 != (char *)0x0) {
              pcVar3 = (char *)(pImage->mFileName)._M_string_length;
              strlen(pcVar14);
              std::__cxx11::string::_M_replace((ulong)pImage,0,pcVar3,(ulong)pcVar14);
            }
            pcVar14 = "ref";
          }
          else {
            iVar4 = (*this->mReader->_vptr_IIrrXMLReader[3])();
            if (iVar4 != 1) goto LAB_004174d2;
            iVar4 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
            iVar4 = strcmp((char *)CONCAT44(extraout_var_03,iVar4),"hex");
            if ((iVar4 != 0) || ((pImage->mFileName)._M_string_length != 0)) goto LAB_004171c1;
            iVar4 = TestAttribute(this,"format");
            if (iVar4 == -1) {
              pLVar6 = DefaultLogger::get();
              Logger::warn(pLVar6,"Collada: Unknown image file format");
            }
            else {
              iVar4 = (*this->mReader->_vptr_IIrrXMLReader[6])();
              pcVar14 = (char *)(pImage->mEmbeddedFormat)._M_string_length;
              strlen((char *)CONCAT44(extraout_var_04,iVar4));
              std::__cxx11::string::_M_replace
                        ((ulong)&pImage->mEmbeddedFormat,0,pcVar14,CONCAT44(extraout_var_04,iVar4));
            }
            pbVar7 = (byte *)GetTextContent(this);
            uVar12 = 0;
            pbVar8 = pbVar7;
            while ((0x20 < (ulong)*pbVar8 || ((0x100003601U >> ((ulong)*pbVar8 & 0x3f) & 1) == 0)))
            {
              pbVar8 = pbVar8 + 1;
              uVar12 = uVar12 + 2;
            }
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                      (&pImage->mImageData,(ulong)uVar12);
            if (uVar12 != 0) {
              uVar9 = 0;
              do {
                uVar11 = (ulong)(uint)((int)uVar9 * 2);
                bVar10 = pbVar7[uVar11];
                bVar13 = bVar10 - 0x30;
                if (9 < bVar13) {
                  if ((byte)(bVar10 + 0x9f) < 6) {
                    bVar13 = bVar10 + 0xa9;
                  }
                  else {
                    bVar13 = bVar10 - 0x37;
                    if (5 < (byte)(bVar10 + 0xbf)) {
                      bVar13 = 0xff;
                    }
                  }
                }
                bVar1 = pbVar7[uVar11 + 1];
                bVar10 = bVar1 - 0x30;
                if (9 < bVar10) {
                  if ((byte)(bVar1 + 0x9f) < 6) {
                    bVar10 = bVar1 + 0xa9;
                  }
                  else {
                    bVar10 = bVar1 - 0x37;
                    if (5 < (byte)(bVar1 + 0xbf)) {
                      bVar10 = 0xff;
                    }
                  }
                }
                (pImage->mImageData).
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start[uVar9] = bVar13 * '\x10' + bVar10;
                uVar9 = uVar9 + 1;
              } while (uVar9 != uVar12);
            }
            pcVar14 = "hex";
          }
          TestClosing(this,pcVar14);
        }
      }
LAB_004171c1:
      iVar4 = (*this->mReader->_vptr_IIrrXMLReader[2])();
    } while ((char)iVar4 != '\0');
  }
  return;
}

Assistant:

void ColladaParser::ReadImage(Collada::Image& pImage)
{
    while (mReader->read())
    {
        if (mReader->getNodeType() == irr::io::EXN_ELEMENT) {
            // Need to run different code paths here, depending on the Collada XSD version
            if (IsElement("image")) {
                SkipElement();
            }
            else if (IsElement("init_from"))
            {
                if (mFormat == FV_1_4_n)
                {
                    // FIX: C4D exporter writes empty <init_from/> tags
                    if (!mReader->isEmptyElement()) {
                        // element content is filename - hopefully
                        const char* sz = TestTextContent();
                        if (sz)pImage.mFileName = sz;
                        TestClosing("init_from");
                    }
                    if (!pImage.mFileName.length()) {
                        pImage.mFileName = "unknown_texture";
                    }
                }
                else if (mFormat == FV_1_5_n)
                {
                    // make sure we skip over mip and array initializations, which
                    // we don't support, but which could confuse the loader if
                    // they're not skipped.
                    int attrib = TestAttribute("array_index");
                    if (attrib != -1 && mReader->getAttributeValueAsInt(attrib) > 0) {
                        ASSIMP_LOG_WARN("Collada: Ignoring texture array index");
                        continue;
                    }

                    attrib = TestAttribute("mip_index");
                    if (attrib != -1 && mReader->getAttributeValueAsInt(attrib) > 0) {
                        ASSIMP_LOG_WARN("Collada: Ignoring MIP map layer");
                        continue;
                    }

                    // TODO: correctly jump over cube and volume maps?
                }
            }
            else if (mFormat == FV_1_5_n)
            {
                if (IsElement("ref"))
                {
                    // element content is filename - hopefully
                    const char* sz = TestTextContent();
                    if (sz)pImage.mFileName = sz;
                    TestClosing("ref");
                }
                else if (IsElement("hex") && !pImage.mFileName.length())
                {
                    // embedded image. get format
                    const int attrib = TestAttribute("format");
                    if (-1 == attrib)
                        ASSIMP_LOG_WARN("Collada: Unknown image file format");
                    else pImage.mEmbeddedFormat = mReader->getAttributeValue(attrib);

                    const char* data = GetTextContent();

                    // hexadecimal-encoded binary octets. First of all, find the
                    // required buffer size to reserve enough storage.
                    const char* cur = data;
                    while (!IsSpaceOrNewLine(*cur)) cur++;

                    const unsigned int size = (unsigned int)(cur - data) * 2;
                    pImage.mImageData.resize(size);
                    for (unsigned int i = 0; i < size; ++i)
                        pImage.mImageData[i] = HexOctetToDecimal(data + (i << 1));

                    TestClosing("hex");
                }
            }
            else
            {
                // ignore the rest
                SkipElement();
            }
        }
        else if (mReader->getNodeType() == irr::io::EXN_ELEMENT_END) {
            if (strcmp(mReader->getNodeName(), "image") == 0)
                break;
        }
    }
}